

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaching-definitions-transfer-function.h
# Opt level: O2

void __thiscall
wasm::analysis::ReachingDefinitionsTransferFunction::evaluateFunctionEntry
          (ReachingDefinitionsTransferFunction *this,Function *func,Element *inputState)

{
  __node_base *p_Var1;
  
  p_Var1 = &(this->fakeSetPtrs)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    FinitePowersetLattice<wasm::LocalSet_*>::add
              (&this->lattice,inputState,(LocalSet *)p_Var1[1]._M_nxt);
  }
  return;
}

Assistant:

void
  evaluateFunctionEntry(Function* func,
                        FinitePowersetLattice<LocalSet*>::Element& inputState) {
    for (auto currSet : fakeSetPtrs) {
      lattice.add(&inputState, currSet);
    }
  }